

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

bool __thiscall
v_hashmap<unsigned_long,_features>::contains
          (v_hashmap<unsigned_long,_features> *this,unsigned_long *key,size_t hash)

{
  hash_elem *phVar1;
  _func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *p_Var2;
  bool bVar3;
  ulong uVar4;
  vw_exception *this_00;
  ulong uVar5;
  ulong uVar6;
  stringstream __msg;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  uVar6 = (long)(this->dat).end_array - (long)(this->dat)._begin >> 7;
  uVar5 = hash % uVar6;
  this->last_position = uVar5;
  uVar4 = uVar5;
  do {
    phVar1 = (this->dat)._begin;
    if (phVar1[uVar4].occupied != true) {
      return phVar1[uVar4].occupied;
    }
    if (phVar1[uVar4].hash == hash) {
      p_Var2 = this->equivalent;
      if (p_Var2 == (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0 &&
          this->equivalent_no_data == (_func_bool_unsigned_long_ptr_unsigned_long_ptr *)0x0) {
        return true;
      }
      if (p_Var2 == (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0) {
        bVar3 = (*this->equivalent_no_data)(key,&phVar1[uVar4].key);
      }
      else {
        bVar3 = (*p_Var2)(this->eq_data,key,&phVar1[uVar4].key);
      }
      if (bVar3 != false) {
        return true;
      }
    }
    uVar4 = this->last_position + 1;
    if (uVar6 <= uVar4) {
      uVar4 = 0;
    }
    this->last_position = uVar4;
    if (uVar4 == uVar5) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"error: v_hashmap did not grow enough!",0x25);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/v_hashmap.h"
                 ,0xfb,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  } while( true );
}

Assistant:

bool contains(const K& key, size_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return false;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return true;

      // there's something there that's NOT us -- advance pointer
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }